

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

BigInteger * __thiscall
BigInteger::_divide_long(BigInteger *__return_storage_ptr__,BigInteger *this,BigInteger *a)

{
  pointer puVar1;
  uint *puVar2;
  iterator __position;
  uint uVar3;
  compare_t cVar4;
  pointer puVar5;
  pointer puVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  int r;
  uint uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  undefined1 uStack_90;
  BigInteger *local_80;
  BigInteger *local_78;
  BigInteger local_70;
  BigInteger local_50;
  
  uVar7 = 0;
  a->negative = false;
  this->negative = false;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  uStack_90 = 0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  cVar4 = _compareAbs(this,a);
  if (cVar4 < CMP_EQUAL) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->digits).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->digits).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 1) = 0;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    cVar4 = _compareAbs(this,a);
    if (CMP_LESS < cVar4) {
      uVar7 = 0;
      do {
        local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                  (&a->digits,
                   (const_iterator)
                   (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_70);
        uVar7 = uVar7 + 1;
        cVar4 = _compareAbs(this,a);
      } while (CMP_LESS < cVar4);
    }
    puVar1 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = puVar1 + 1;
    if (puVar6 != puVar5) {
      memmove(puVar1,puVar6,(long)puVar5 - (long)puVar6);
      puVar5 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + -1;
    local_78 = __return_storage_ptr__;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_a8,(ulong)uVar7);
    local_80 = this;
    __return_storage_ptr__ = local_78;
    for (; uVar7 != 0; uVar7 = uVar7 - 1) {
      uVar11 = 1000000000;
      uVar8 = 0;
      local_78 = __return_storage_ptr__;
      do {
        uVar10 = (int)(uVar11 + uVar8) / 2;
        BigInteger(&local_50,(long)(int)uVar10);
        ::operator*(&local_70,a,&local_50);
        cVar4 = _compareAbs(local_80,&local_70);
        if ((void *)CONCAT44(local_70.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (uint)local_70.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_70.digits.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (uint)local_70.digits.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
        }
        if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar3 = uVar10;
        if (CMP_LESS < cVar4) {
          uVar3 = uVar11;
          uVar8 = uVar10;
        }
        uVar11 = uVar3;
      } while ((int)(uVar8 + 1) < (int)uVar11);
      __position._M_current._1_7_ =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish._1_7_;
      __position._M_current._0_1_ =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish._0_1_;
      local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar8;
      if (__position._M_current ==
          (uint *)CONCAT71(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_a8,__position,(uint *)&local_70);
      }
      else {
        *__position._M_current = uVar8;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = SUB81(__position._M_current + 1,0);
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ =
             (undefined7)((ulong)(__position._M_current + 1) >> 8);
      }
      BigInteger(&local_50,(long)(int)uVar8);
      ::operator*(&local_70,a,&local_50);
      operator-=(local_80,&local_70);
      if ((void *)CONCAT44(local_70.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (uint)local_70.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_70.digits.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_70.digits.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
      }
      if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      puVar1 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = puVar1 + 1;
      if (puVar6 != puVar5) {
        memmove(puVar1,puVar6,(long)puVar5 - (long)puVar6);
        puVar5 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
      (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5 + -1;
      __return_storage_ptr__ = local_78;
    }
    puVar1 = (pointer)CONCAT71(local_a8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish._1_7_,
                               local_a8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish._0_1_);
    puVar6 = puVar1 + -1;
    puVar2 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start < puVar6 &&
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != puVar1) {
      do {
        puVar9 = puVar2 + 1;
        uVar7 = *puVar2;
        *puVar2 = *puVar6;
        *puVar6 = uVar7;
        puVar6 = puVar6 + -1;
        puVar2 = puVar9;
      } while (puVar9 < puVar6);
    }
    while (puVar1 != local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      puVar6 = puVar1 + -1;
      if (*puVar6 != 0) {
        if (puVar1 != local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start) goto LAB_0012470b;
        break;
      }
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = SUB81(puVar6,0);
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)puVar6 >> 8);
      puVar1 = puVar6;
    }
    uStack_90 = false;
LAB_0012470b:
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish._1_7_,
                           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_1_);
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    __return_storage_ptr__->negative = (bool)uStack_90;
  }
  return __return_storage_ptr__;
}

Assistant:

const BigInteger BigInteger::_divide_long(BigInteger a) noexcept
{
    negative = a.negative = false;
    BigInteger ans;
    if(_compareAbs(a) < 0)
        return 0;
    int shift = 0;
    while(_compareAbs(a) >= 0)
    {
        a.digits.insert(a.digits.begin(), 0);
        ++shift;
    }
    a.digits.erase(a.digits.begin());
    ans.digits.reserve(shift);
    for(; shift; --shift)
    {
        int l = 0, r = BLOCK_MOD;
        while(l + 1 < r)
        {
            int m = (l + r) / 2;
            if(_compareAbs(a * m) < 0)
                r = m;
            else
                l = m;
        }
        ans.digits.push_back(l);
        *this -= a * l;
        a.digits.erase(a.digits.begin());
    }
    std::reverse(ans.digits.begin(), ans.digits.end());
    ans.normalize();
    return ans;
}